

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

int ParseExpLogAnd(char **p,aint *nval)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  aint right;
  int local_34;
  
  _right = in_RAX;
  iVar1 = ParseExpBitOr(p,&local_34);
  iVar2 = 0;
  if (iVar1 != 0) {
    iVar1 = local_34;
    while (iVar2 = need(p,"&&"), iVar2 != 0) {
      iVar2 = ParseExpBitOr(p,&right);
      if (iVar2 == 0) {
        return 0;
      }
      iVar1 = -(uint)(right != 0 && iVar1 != 0);
    }
    *nval = iVar1;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int ParseExpLogAnd(char*& p, aint& nval) {
	aint left, right;
	if (!ParseExpBitOr(p, left)) return 0;
	while (need(p, "&&")) {
		if (!ParseExpBitOr(p, right)) return 0;
		left = -(left && right);
	}
	nval = left;
	return 1;
}